

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall AggressiveBotStrategy::attackNumDice(AggressiveBotStrategy *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *((this->super_PlayerStrategy).from)->pNumberOfTroops;
  iVar2 = 3;
  if (iVar1 < 4) {
    iVar2 = iVar1 + -1;
  }
  return iVar2;
}

Assistant:

int AggressiveBotStrategy::attackNumDice() {
    int numDice = 0;
    if (from->getNumberOfTroops() > 3) {
        numDice = 3;
    }
    else {
        numDice = from->getNumberOfTroops() - 1;
    }
    return numDice;
}